

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void __thiscall CVmDateLocale::set(CVmDateLocale *this,CVmUndo *undo,int idx,vm_val_t *val)

{
  vm_datatype_t vVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  CVmObject *pCVar4;
  int in_EDX;
  CVmMetaclass *in_RDI;
  vm_val_t val_1;
  int i;
  vm_val_t nil;
  size_t in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  CVmObject *in_stack_ffffffffffffffa8;
  vm_obj_id_t in_stack_ffffffffffffffbc;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffc0;
  int local_34;
  vm_val_t local_30;
  int local_14;
  
  local_14 = in_EDX;
  if (((anon_union_8_8_cb74652f_for_val *)&in_RDI->meta_reg_idx_)->ptr != (void *)0x0)
  goto LAB_002f627e;
  vVar1 = CVmObjVector::create
                    ((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_ffffffffffffff98);
  *(vm_datatype_t *)&in_RDI->_vptr_CVmMetaclass = vVar1;
  if (*(vm_datatype_t *)&in_RDI->_vptr_CVmMetaclass == 0) {
LAB_002f61ad:
    in_stack_ffffffffffffffa8 = (CVmObject *)0x0;
  }
  else {
    pCVar4 = vm_objp(0);
    iVar2 = (*pCVar4->_vptr_CVmObject[1])(pCVar4,CVmObjVector::metaclass_reg_);
    if (iVar2 == 0) goto LAB_002f61ad;
    in_stack_ffffffffffffffa8 = vm_objp(0);
  }
  ((anon_union_8_8_cb74652f_for_val *)&in_RDI->meta_reg_idx_)->native_desc =
       (CVmNativeCodeDesc *)in_stack_ffffffffffffffa8;
  vm_val_t::set_nil(&local_30);
  for (local_34 = 0; local_34 < 0xf; local_34 = local_34 + 1) {
    CVmObjVector::append_element
              ((CVmObjVector *)in_stack_ffffffffffffffc0.native_desc,in_stack_ffffffffffffffbc,
               (vm_val_t *)in_RDI);
  }
  vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffb8,
                    *(vm_datatype_t *)&in_RDI->_vptr_CVmMetaclass);
  vVar3 = CVmMetaclass::get_class_obj(in_RDI);
  if (vVar3 != 0) {
    CVmMetaclass::get_class_obj(in_RDI);
    pCVar4 = vm_objp(0);
    iVar2 = (*pCVar4->_vptr_CVmObject[1])(pCVar4,CVmObjClass::metaclass_reg_);
    if (iVar2 != 0) {
      CVmMetaclass::get_class_obj(in_RDI);
      vm_objp(0);
    }
  }
  CVmObjClass::set_class_state((CVmObjClass *)in_RDI,(vm_val_t *)in_stack_ffffffffffffffa8);
LAB_002f627e:
  if ((-1 < local_14) && (local_14 < 0xf)) {
    CVmObjVector::set_element_undo
              ((CVmObjVector *)in_stack_ffffffffffffffc0.native_desc,in_stack_ffffffffffffffbc,
               (size_t)in_RDI,(vm_val_t *)in_stack_ffffffffffffffa8);
    return;
  }
  err_throw(0);
}

Assistant:

void set(VMG_ CVmUndo *undo, int idx, const vm_val_t *val)
    {
        /* if we don't have a vector, create one */
        if (vec == 0)
        {
            /* create the vector */
            vecid = CVmObjVector::create(vmg_ FALSE, ndefaults);
            vec = vm_objid_cast(CVmObjVector, vecid);

            /* initialize all elements to nil */
            vm_val_t nil;
            nil.set_nil();
            for (int i = 0 ; i < ndefaults ; ++i)
                vec->append_element(vmg_ vecid, &nil);

            /* store the vector in the class object's state holder */
            vm_val_t val;
            val.set_obj(vecid);
            vm_classobj_for(CVmObjDate)->set_class_state(&val);
        }

        /* if it's out of bounds, it's an error */
        if (idx < 0 || idx >= ndefaults)
            err_throw(VMERR_INDEX_OUT_OF_RANGE);

        /* set the specified element */
        vec->set_element_undo(vmg_ vecid, idx, val);
    }